

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

Info * __thiscall
re2::Regexp::Walker<re2::Prefilter::Info_*>::WalkInternal
          (Walker<re2::Prefilter::Info_*> *this,Regexp *re,Info *top_arg,bool use_copy)

{
  stack<re2::WalkState<re2::Prefilter::Info_*>,_std::deque<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>_>
  *psVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  void *pvVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type sVar7;
  WalkState<re2::Prefilter::Info_*> local_248;
  Regexp **local_218;
  Regexp **sub;
  Regexp *pRStack_208;
  bool stop;
  Regexp *re_1;
  Info *t;
  WalkState<re2::Prefilter::Info_*> *s;
  LogMessage local_1b0;
  byte local_29;
  Info *pIStack_28;
  bool use_copy_local;
  Info *top_arg_local;
  Regexp *re_local;
  Walker<re2::Prefilter::Info_*> *this_local;
  
  local_29 = use_copy;
  pIStack_28 = top_arg;
  top_arg_local = (Info *)re;
  re_local = (Regexp *)this;
  Reset(this);
  if (top_arg_local == (Info *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0);
    poVar4 = LogMessage::stream(&local_1b0);
    std::operator<<(poVar4,"Walk NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    return pIStack_28;
  }
  psVar1 = this->stack_;
  WalkState<re2::Prefilter::Info_*>::WalkState
            ((WalkState<re2::Prefilter::Info_*> *)&s,(Regexp *)top_arg_local,pIStack_28);
  std::
  stack<re2::WalkState<re2::Prefilter::Info_*>,_std::deque<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>_>
  ::push(psVar1,(value_type *)&s);
  do {
    while( true ) {
      t = (Info *)std::
                  stack<re2::WalkState<re2::Prefilter::Info_*>,_std::deque<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>_>
                  ::top(this->stack_);
      pRStack_208 = *(Regexp **)&(t->exact_)._M_t._M_impl;
      if ((t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color != ~_S_red) break;
      iVar3 = this->max_visits_ + -1;
      this->max_visits_ = iVar3;
      if (iVar3 < 0) {
        this->stopped_early_ = true;
        iVar3 = (*this->_vptr_Walker[5])
                          (this,pRStack_208,
                           (Info *)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent);
        re_1 = (Regexp *)CONCAT44(extraout_var,iVar3);
      }
      else {
        sub._7_1_ = 0;
        iVar3 = (*this->_vptr_Walker[2])
                          (this,pRStack_208,
                           (Info *)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent,(long)&sub + 7);
        (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)CONCAT44(extraout_var_00,iVar3);
        if ((sub._7_1_ & 1) == 0) {
          (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          if (pRStack_208->nsub_ == 1) {
            (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 (size_t)&(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
          }
          else if (1 < pRStack_208->nsub_) {
            auVar2 = ZEXT216(pRStack_208->nsub_) * ZEXT816(8);
            uVar5 = auVar2._0_8_;
            if (auVar2._8_8_ != 0) {
              uVar5 = 0xffffffffffffffff;
            }
            pvVar6 = operator_new__(uVar5);
            (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)pvVar6;
          }
          break;
        }
        re_1 = (Regexp *)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      }
LAB_0016038a:
      std::
      stack<re2::WalkState<re2::Prefilter::Info_*>,_std::deque<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>_>
      ::pop(this->stack_);
      sVar7 = std::
              stack<re2::WalkState<re2::Prefilter::Info_*>,_std::deque<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>_>
              ::size(this->stack_);
      if (sVar7 == 0) {
        return (Info *)re_1;
      }
      t = (Info *)std::
                  stack<re2::WalkState<re2::Prefilter::Info_*>,_std::deque<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>_>
                  ::top(this->stack_);
      if ((Info **)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count == (Info **)0x0) {
        (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)re_1;
      }
      else {
        ((Info **)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count)
        [(int)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color] = (Info *)re_1;
      }
      (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color + _S_black;
    }
    if ((pRStack_208->nsub_ == 0) ||
       (local_218 = Regexp::sub(pRStack_208),
       (int)(uint)pRStack_208->nsub_ <=
       (int)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color)) {
      iVar3 = (*this->_vptr_Walker[3])
                        (this,pRStack_208,
                         (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                         (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                         (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (ulong)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
      re_1 = (Regexp *)CONCAT44(extraout_var_02,iVar3);
      if ((1 < pRStack_208->nsub_) &&
         (pvVar6 = (void *)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count,
         pvVar6 != (void *)0x0)) {
        operator_delete__(pvVar6);
      }
      goto LAB_0016038a;
    }
    if (((local_29 & 1) == 0) ||
       (((int)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color < 1 ||
        (local_218[(int)((t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color -
                        _S_black)] !=
         local_218[(int)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color])))) {
      psVar1 = this->stack_;
      WalkState<re2::Prefilter::Info_*>::WalkState
                (&local_248,
                 local_218[(int)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color],
                 (Info *)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left);
      std::
      stack<re2::WalkState<re2::Prefilter::Info_*>,_std::deque<re2::WalkState<re2::Prefilter::Info_*>,_std::allocator<re2::WalkState<re2::Prefilter::Info_*>_>_>_>
      ::push(psVar1,&local_248);
    }
    else {
      iVar3 = (*this->_vptr_Walker[4])
                        (this,*(undefined8 *)
                               ((t->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count +
                               (long)(int)((t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header.
                                           _M_color - _S_black) * 8));
      *(ulong *)((t->exact_)._M_t._M_impl.super__Rb_tree_header._M_node_count +
                (long)(int)(t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color * 8) =
           CONCAT44(extraout_var_01,iVar3);
      (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (t->exact_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color + _S_black;
    }
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}